

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS CanKeyNameBeBare(char *KeyName)

{
  char cVar1;
  size_t sVar2;
  ulong uStack_28;
  char currentChar;
  size_t i;
  size_t length;
  _Bool canBeBare;
  char *KeyName_local;
  
  length._7_1_ = 1;
  sVar2 = strlen(KeyName);
  uStack_28 = 0;
  do {
    if (sVar2 <= uStack_28) {
LAB_00126da7:
      return (JL_STATUS)length._7_1_;
    }
    cVar1 = KeyName[uStack_28];
    if (((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
        ((cVar1 != '_' && (cVar1 != '$')))) &&
       ((uStack_28 == 0 || ((cVar1 < '0' || ('9' < cVar1)))))) {
      length._7_1_ = 0;
      goto LAB_00126da7;
    }
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

static
JL_STATUS
    CanKeyNameBeBare
    (
        char const*             KeyName
    )
{
    bool canBeBare = true;
    size_t length = strlen( KeyName );

    for( size_t i=0; i<length; i++ )
    {
        char const currentChar = KeyName[i];
        if(     ( currentChar >= 'a' && currentChar <= 'z' )
            ||  ( currentChar >= 'A' && currentChar <= 'Z' )
            ||  '_' == currentChar
            ||  '$' == currentChar )
        {
            // Valid char for bareword
        }
        else if(    i > 0
                 && ( currentChar >= '0' && currentChar <= '9' ) )
        {
            // Valid char (as long as it is not the first char
        }
        else
        {
            // Character can not be in a bare keyword
            canBeBare = false;
            break;
        }
    }

    return canBeBare;
}